

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::SobolSampler::sampleDimension(SobolSampler *this,int dimension)

{
  RandomizeStrategy RVar1;
  ulong v;
  uint64_t uVar2;
  float fVar3;
  
  v = (ulong)(uint)dimension;
  if (1 < dimension) {
    RVar1 = this->randomizeStrategy;
    if (RVar1 == Xor) {
      uVar2 = MixBits(v);
      fVar3 = SobolSampleFloat<pbrt::XORScrambler>
                        (this->sequenceIndex,dimension,(XORScrambler)(uint32_t)uVar2);
      return fVar3;
    }
    if (RVar1 == CranleyPatterson) {
      uVar2 = MixBits(v);
      fVar3 = SobolSampleFloat<pbrt::CranleyPattersonRotator>
                        (this->sequenceIndex,dimension,(CranleyPattersonRotator)(uint32_t)uVar2);
      return fVar3;
    }
    if (RVar1 != None) {
      uVar2 = MixBits(v);
      fVar3 = SobolSampleFloat<pbrt::OwenScrambler>
                        (this->sequenceIndex,dimension,(OwenScrambler)(uint32_t)uVar2);
      return fVar3;
    }
  }
  fVar3 = SobolSampleFloat<pbrt::NoRandomizer>(this->sequenceIndex,v);
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
    Float sampleDimension(int dimension) const {
        if (dimension < 2 || randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sequenceIndex, dimension, NoRandomizer());

        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson) {
            uint32_t hash = MixBits(dimension);
            return SobolSample(sequenceIndex, dimension, CranleyPattersonRotator(hash));
        } else if (randomizeStrategy == RandomizeStrategy::Xor) {
            // Only use the dimension! (Want the same scrambling over all
            // pixels).
            uint32_t hash = MixBits(dimension);
            return SobolSample(sequenceIndex, dimension, XORScrambler(hash));
        } else {
            DCHECK(randomizeStrategy == RandomizeStrategy::Owen);
            uint32_t seed = MixBits(dimension);  // Only dimension!
            return SobolSample(sequenceIndex, dimension, OwenScrambler(seed));
        }
    }